

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

bool helics::isTrueString(string_view str)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  _Self in_stack_ffffffffffffffd8;
  _Self local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if ((sVar2 == 1) &&
     (pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
     *pvVar3 == '1')) {
    return true;
  }
  sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if ((sVar2 == 1) &&
     (pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
     *pvVar3 == '0')) {
    return false;
  }
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::find(in_stack_ffffffffffffffd8._M_node,(key_type *)0x3a0b39);
  CLI::std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         *)in_stack_ffffffffffffffd8._M_node);
  bVar1 = CLI::std::operator==(&local_20,(_Self *)&stack0xffffffffffffffd8);
  return bVar1;
}

Assistant:

bool isTrueString(const std::string_view str)
{
    if (str.size() == 1 && str[0] == '1') {
        return true;
    }
    if (str.size() == 1 && str[0] == '0') {
        return false;
    }
    return (falseString.find(str) == falseString.end());
}